

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecFindCost(Sfm_Dec_t *p,int c,int iLit,word *pMask)

{
  int iVar1;
  int fCompl;
  word *x;
  word *pPats;
  word *pMask_local;
  int iLit_local;
  int c_local;
  Sfm_Dec_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  x = Sfm_DecDivPats(p,iVar1,(uint)((c != 0 ^ 0xffU) & 1));
  iVar1 = p->nPatWords[(int)(uint)((c != 0 ^ 0xffU) & 1)];
  fCompl = Abc_LitIsCompl(iLit);
  iVar1 = Abc_TtCountOnesVecMask(x,pMask,iVar1,fCompl);
  return iVar1;
}

Assistant:

int Sfm_DecFindCost( Sfm_Dec_t * p, int c, int iLit, word * pMask )
{
    word * pPats = Sfm_DecDivPats( p, Abc_Lit2Var(iLit), !c );
    return Abc_TtCountOnesVecMask( pPats, pMask, p->nPatWords[!c], Abc_LitIsCompl(iLit) );
}